

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeAssociativeContainer<QHash<QFont::Tag,unsigned_int>>
          (QDataStream *s,QHash<QFont::Tag,_unsigned_int> *c)

{
  long lVar1;
  bool bVar2;
  QHash<QFont::Tag,_unsigned_int> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDataStream *in_stack_ffffffffffffff98;
  QDataStream *in_stack_ffffffffffffffa0;
  QDataStream *in_stack_ffffffffffffffa8;
  Tag tag;
  QDataStream *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QHash<QFont::Tag,_unsigned_int>::size(in_RSI);
  bVar2 = QDataStream::writeQSizeType(in_stack_ffffffffffffff98,0x731af1);
  if (bVar2) {
    QHash<QFont::Tag,_unsigned_int>::constBegin(in_RSI);
    QHash<QFont::Tag,_unsigned_int>::constEnd
              ((QHash<QFont::Tag,_unsigned_int> *)in_stack_ffffffffffffffa8);
    while( true ) {
      bVar2 = QHash<QFont::Tag,_unsigned_int>::const_iterator::operator!=
                        ((const_iterator *)in_stack_ffffffffffffffa8,
                         (const_iterator *)in_stack_ffffffffffffffa0);
      tag.m_value = (quint32)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      if (!bVar2) break;
      in_stack_ffffffffffffffa0 = in_RDI;
      QHash<QFont::Tag,_unsigned_int>::const_iterator::key((const_iterator *)0x731b85);
      in_stack_ffffffffffffffa8 = ::operator<<(in_stack_ffffffffffffffa0,tag);
      QHash<QFont::Tag,_unsigned_int>::const_iterator::value((const_iterator *)0x731ba8);
      QDataStream::operator<<
                (in_stack_ffffffffffffffa0,(quint32)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      QHash<QFont::Tag,_unsigned_int>::const_iterator::operator++((const_iterator *)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}